

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O0

adjusted_mantissa __thiscall
fast_float::positive_digit_comp<float>(fast_float *this,bigint *bigmant,int32_t exponent)

{
  ulong uVar1;
  adjusted_mantissa *a;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  double in_XMM0_Qa;
  adjusted_mantissa aVar6;
  bool local_45;
  int bias;
  bool truncated;
  fast_float *pfStack_40;
  int32_t exponent_local;
  bigint *bigmant_local;
  adjusted_mantissa answer;
  int local_20;
  int local_1c;
  int32_t shift;
  int32_t mantissa_shift;
  anon_class_1_1_756fe65e local_9;
  
  bias = (int)bigmant;
  pfStack_40 = this;
  bigint::pow10((bigint *)this,in_XMM0_Qa);
  adjusted_mantissa::adjusted_mantissa((adjusted_mantissa *)&bigmant_local);
  bigmant_local = (bigint *)bigint::hi64((bigint *)pfStack_40,&local_45);
  iVar2 = binary_format<float>::mantissa_explicit_bits();
  iVar3 = binary_format<float>::minimum_exponent();
  iVar4 = bigint::bit_length((bigint *)pfStack_40);
  answer.mantissa._0_4_ = iVar4 + -0x40 + (iVar2 - iVar3);
  local_9.truncated = (bool)(local_45 & 1);
  _shift = (adjusted_mantissa *)&bigmant_local;
  local_1c = binary_format<float>::mantissa_explicit_bits();
  a = _shift;
  local_1c = 0x3f - local_1c;
  if (-_shift->power2 < local_1c) {
    positive_digit_comp<float>::anon_class_1_1_756fe65e::operator()(&local_9,_shift,local_1c);
    uVar1 = _shift->mantissa;
    iVar2 = binary_format<float>::mantissa_explicit_bits();
    if ((ulong)(2L << ((byte)iVar2 & 0x3f)) <= uVar1) {
      iVar2 = binary_format<float>::mantissa_explicit_bits();
      _shift->mantissa = 1L << ((byte)iVar2 & 0x3f);
      _shift->power2 = _shift->power2 + 1;
    }
    iVar2 = binary_format<float>::mantissa_explicit_bits();
    _shift->mantissa = (1L << ((byte)iVar2 & 0x3f) ^ 0xffffffffffffffffU) & _shift->mantissa;
    iVar2 = _shift->power2;
    iVar3 = binary_format<float>::infinite_power();
    if (iVar3 <= iVar2) {
      iVar2 = binary_format<float>::infinite_power();
      _shift->power2 = iVar2;
      _shift->mantissa = 0;
    }
  }
  else {
    local_20 = 1 - _shift->power2;
    answer._12_4_ = 0x40;
    piVar5 = std::min<int>(&local_20,(int *)&answer.field_0xc);
    positive_digit_comp<float>::anon_class_1_1_756fe65e::operator()(&local_9,a,*piVar5);
    uVar1 = _shift->mantissa;
    iVar2 = binary_format<float>::mantissa_explicit_bits();
    _shift->power2 = (uint)((ulong)(1L << ((byte)iVar2 & 0x3f)) <= uVar1);
  }
  aVar6.power2 = (int)answer.mantissa;
  aVar6.mantissa = (uint64_t)bigmant_local;
  aVar6._12_4_ = 0;
  return aVar6;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
adjusted_mantissa positive_digit_comp(bigint& bigmant, int32_t exponent) noexcept {
  FASTFLOAT_ASSERT(bigmant.pow10(uint32_t(exponent)));
  adjusted_mantissa answer;
  bool truncated;
  answer.mantissa = bigmant.hi64(truncated);
  int bias = binary_format<T>::mantissa_explicit_bits() - binary_format<T>::minimum_exponent();
  answer.power2 = bigmant.bit_length() - 64 + bias;

  round<T>(answer, [truncated](adjusted_mantissa& a, int32_t shift) {
    round_nearest_tie_even(a, shift, [truncated](bool is_odd, bool is_halfway, bool is_above) -> bool {
      return is_above || (is_halfway && truncated) || (is_odd && is_halfway);
    });
  });

  return answer;
}